

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

bool __thiscall
caffe::NetStateRule::MergePartialFromCodedStream(NetStateRule *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *pCVar1;
  bool bVar2;
  int iVar3;
  WireType WVar4;
  pair<unsigned_int,_bool> pVar5;
  string *psVar6;
  char *pcVar7;
  UnknownFieldSet *pUVar8;
  bool local_89;
  Phase local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  NetStateRule *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x10000409 = input;
LAB_0076627b:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    if ((stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) &&
       (tag_2 = (uint32)*stack0xffffffffffffff98->buffer_,
       '\0' < (char)*stack0xffffffffffffff98->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar5 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback
                              (stack0xffffffffffffff98,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar5 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    local_74 = local_10;
    p.first = local_74;
    if ((uStack_c & 1) == 0) goto switchD_00766492_default;
    iVar3 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    pCVar1 = stack0xffffffffffffff98;
    switch(iVar3) {
    case 1:
      if ((p.first & 0xff) == 8) {
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_78);
        if (!bVar2) {
          return false;
        }
        bVar2 = Phase_IsValid(local_78);
        if (bVar2) {
          set_phase(this,local_78);
        }
        else {
          pUVar8 = mutable_unknown_fields(this);
          google::protobuf::UnknownFieldSet::AddVarint(pUVar8,1,(long)(int)local_78);
        }
        goto LAB_0076627b;
      }
      break;
    case 2:
      if ((p.first & 0xff) != 0x10) break;
      set_has_min_level(this);
      bVar2 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (stack0xffffffffffffff98,&this->min_level_);
      goto joined_r0x00766564;
    case 3:
      if ((p.first & 0xff) == 0x18) {
        set_has_max_level(this);
        bVar2 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (stack0xffffffffffffff98,&this->max_level_);
        goto joined_r0x00766564;
      }
      break;
    case 4:
      if ((p.first & 0xff) == 0x22) {
        psVar6 = add_stage_abi_cxx11_(this);
        bVar2 = google::protobuf::internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        iVar3 = stage_size(this);
        stage_abi_cxx11_(this,iVar3 + -1);
        pcVar7 = (char *)std::__cxx11::string::data();
        iVar3 = stage_size(this);
        stage_abi_cxx11_(this,iVar3 + -1);
        iVar3 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"caffe.NetStateRule.stage");
        goto LAB_0076627b;
      }
      break;
    case 5:
      if ((p.first & 0xff) == 0x2a) {
        psVar6 = add_not_stage_abi_cxx11_(this);
        bVar2 = google::protobuf::internal::WireFormatLite::ReadString(pCVar1,psVar6);
        if (!bVar2) {
          return false;
        }
        iVar3 = not_stage_size(this);
        not_stage_abi_cxx11_(this,iVar3 + -1);
        pcVar7 = (char *)std::__cxx11::string::data();
        iVar3 = not_stage_size(this);
        not_stage_abi_cxx11_(this,iVar3 + -1);
        iVar3 = std::__cxx11::string::length();
        google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar7,iVar3,PARSE,"caffe.NetStateRule.not_stage");
        goto LAB_0076627b;
      }
    }
switchD_00766492_default:
    if ((p.first == 0) ||
       (WVar4 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
       pCVar1 = stack0xffffffffffffff98, tag_00 = p.first, WVar4 == WIRETYPE_END_GROUP)) {
      return true;
    }
    pUVar8 = mutable_unknown_fields(this);
    bVar2 = google::protobuf::internal::WireFormat::SkipField(pCVar1,tag_00,pUVar8);
joined_r0x00766564:
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool NetStateRule::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetStateRule)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.Phase phase = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 min_level = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_min_level();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &min_level_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 max_level = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_max_level();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &max_level_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string stage = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_stage()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->stage(this->stage_size() - 1).data(),
            this->stage(this->stage_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetStateRule.stage");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string not_stage = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_not_stage()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->not_stage(this->not_stage_size() - 1).data(),
            this->not_stage(this->not_stage_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetStateRule.not_stage");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetStateRule)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetStateRule)
  return false;
#undef DO_
}